

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ParseFrameworkMappings(ImportWriter *this)

{
  ProtoFrameworkCollector *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  undefined1 local_40 [8];
  string parse_error;
  ProtoFrameworkCollector collector;
  ImportWriter *this_local;
  
  this->need_to_parse_mapping_file_ = false;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = (ProtoFrameworkCollector *)((long)&parse_error.field_2 + 8);
    ProtoFrameworkCollector::ProtoFrameworkCollector(this_00,&this->proto_file_to_framework_name_);
    std::__cxx11::string::string((string *)local_40);
    bVar1 = ParseSimpleFile(&this->named_framework_to_proto_path_mappings_path_,
                            (LineConsumer *)this_00,(string *)local_40);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"error parsing ");
      poVar3 = std::operator<<(poVar3,(string *)&this->named_framework_to_proto_path_mappings_path_)
      ;
      poVar3 = std::operator<<(poVar3," : ");
      poVar3 = std::operator<<(poVar3,(string *)local_40);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
    }
    std::__cxx11::string::~string((string *)local_40);
    ProtoFrameworkCollector::~ProtoFrameworkCollector
              ((ProtoFrameworkCollector *)((long)&parse_error.field_2 + 8));
  }
  return;
}

Assistant:

void ImportWriter::ParseFrameworkMappings() {
  need_to_parse_mapping_file_ = false;
  if (named_framework_to_proto_path_mappings_path_.empty()) {
    return;  // Nothing to do.
  }

  ProtoFrameworkCollector collector(&proto_file_to_framework_name_);
  string parse_error;
  if (!ParseSimpleFile(named_framework_to_proto_path_mappings_path_,
                       &collector, &parse_error)) {
    cerr << "error parsing " << named_framework_to_proto_path_mappings_path_
         << " : " << parse_error << endl;
    cerr.flush();
  }
}